

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O0

string * kratos::fs::abspath(string *__return_storage_ptr__,string *filename)

{
  char *pcVar1;
  allocator<char> local_21;
  char *local_20;
  char *path;
  string *filename_local;
  
  path = (char *)filename;
  filename_local = __return_storage_ptr__;
  pcVar1 = (char *)std::__cxx11::string::c_str();
  pcVar1 = realpath(pcVar1,(char *)0x0);
  local_20 = pcVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,pcVar1,&local_21);
  std::allocator<char>::~allocator(&local_21);
  return __return_storage_ptr__;
}

Assistant:

std::string abspath(const std::string &filename) {
#if defined(INCLUDE_FILESYSTEM)
    return std::filesystem::absolute(filename);
#else
#if defined(NO_FS_HAS_REALPATH)
    auto path = realpath(filename.c_str(), nullptr);
#else
    auto path = _fullpath(NULL, filename.c_str(), 120);
#endif
    return std::string(path);
#endif
}